

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool __thiscall
re2::Regexp::RequiredPrefix(Regexp *this,string *prefix,bool *foldcase,Regexp **suffix)

{
  ushort uVar1;
  Regexp *this_00;
  int iVar2;
  ParseFlags PVar3;
  Regexp **ppRVar4;
  Regexp *pRVar5;
  bool bVar6;
  int local_9c;
  anon_union_16_7_2f55f9ff_for_Regexp_10 *local_98;
  size_t in_stack_ffffffffffffff80;
  int nrunes;
  Rune *runes;
  bool latin1;
  int local_44;
  int j;
  Regexp *re;
  int i;
  Regexp **suffix_local;
  bool *foldcase_local;
  string *prefix_local;
  Regexp *this_local;
  
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prefix);
  *foldcase = false;
  *suffix = (Regexp *)0x0;
  if (this->op_ == '\x05') {
    re._4_4_ = 0;
    while( true ) {
      bVar6 = false;
      if (re._4_4_ < (int)(uint)this->nsub_) {
        ppRVar4 = sub(this);
        bVar6 = ppRVar4[re._4_4_]->op_ == '\x12';
      }
      if (!bVar6) break;
      re._4_4_ = re._4_4_ + 1;
    }
    if ((re._4_4_ == 0) || ((int)(uint)this->nsub_ <= re._4_4_)) {
      this_local._7_1_ = false;
    }
    else {
      ppRVar4 = sub(this);
      this_00 = ppRVar4[re._4_4_];
      if ((this_00->op_ == '\x03') || (this_00->op_ == '\x04')) {
        iVar2 = re._4_4_ + 1;
        local_44 = iVar2;
        if (iVar2 < (int)(uint)this->nsub_) {
          for (; local_44 < (int)(uint)this->nsub_; local_44 = local_44 + 1) {
            ppRVar4 = sub(this);
            Incref(ppRVar4[local_44]);
          }
          ppRVar4 = sub(this);
          ppRVar4 = ppRVar4 + iVar2;
          uVar1 = this->nsub_;
          PVar3 = parse_flags(this);
          pRVar5 = Concat(ppRVar4,(uint)uVar1 - iVar2,PVar3);
          *suffix = pRVar5;
        }
        else {
          pRVar5 = (Regexp *)operator_new(in_stack_ffffffffffffff80);
          PVar3 = parse_flags(this);
          Regexp(pRVar5,kRegexpEmptyMatch,PVar3);
          *suffix = pRVar5;
        }
        PVar3 = parse_flags(this_00);
        PVar3 = operator&(PVar3,Latin1);
        if (this_00->op_ == '\x03') {
          local_98 = &this_00->field_7;
        }
        else {
          local_98 = (anon_union_16_7_2f55f9ff_for_Regexp_10 *)(this_00->field_7).field_2.runes_;
        }
        if (this_00->op_ == '\x03') {
          local_9c = 1;
        }
        else {
          local_9c = (this_00->field_7).field_0.max_;
        }
        ConvertRunesToBytes(PVar3 != NoParseFlags,&local_98->rune_,local_9c,prefix);
        PVar3 = parse_flags(this_00);
        PVar3 = operator&(PVar3,FoldCase);
        *foldcase = PVar3 != NoParseFlags;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Regexp::RequiredPrefix(std::string* prefix, bool* foldcase,
                            Regexp** suffix) {
  prefix->clear();
  *foldcase = false;
  *suffix = NULL;

  // No need for a walker: the regexp must be of the form
  // 1. some number of ^ anchors
  // 2. a literal char or string
  // 3. the rest
  if (op_ != kRegexpConcat)
    return false;
  int i = 0;
  while (i < nsub_ && sub()[i]->op_ == kRegexpBeginText)
    i++;
  if (i == 0 || i >= nsub_)
    return false;
  Regexp* re = sub()[i];
  if (re->op_ != kRegexpLiteral &&
      re->op_ != kRegexpLiteralString)
    return false;
  i++;
  if (i < nsub_) {
    for (int j = i; j < nsub_; j++)
      sub()[j]->Incref();
    *suffix = Concat(sub() + i, nsub_ - i, parse_flags());
  } else {
    *suffix = new Regexp(kRegexpEmptyMatch, parse_flags());
  }

  bool latin1 = (re->parse_flags() & Latin1) != 0;
  Rune* runes = re->op_ == kRegexpLiteral ? &re->rune_ : re->runes_;
  int nrunes = re->op_ == kRegexpLiteral ? 1 : re->nrunes_;
  ConvertRunesToBytes(latin1, runes, nrunes, prefix);
  *foldcase = (re->parse_flags() & FoldCase) != 0;
  return true;
}